

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emap.c
# Opt level: O2

void duckdb_je_emap_do_assert_not_mapped(tsdn_t *tsdn,emap_t *emap,edata_t *edata)

{
  void *pvVar1;
  ulong uVar2;
  rtree_ctx_t *prVar3;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_contents_t local_1c0;
  rtree_ctx_t local_1a8;
  
  pvVar1 = edata->e_addr;
  if (tsdn == (tsdn_t *)0x0) {
    prVar3 = &local_1a8;
    duckdb_je_rtree_ctx_data_init(prVar3);
  }
  else {
    prVar3 = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  rtree_read_independent(tsdn,&emap->rtree,prVar3,(ulong)pvVar1 & 0xfffffffffffff000,&local_1c0);
  pvVar1 = edata->e_addr;
  uVar2 = (edata->field_2).e_size_esn;
  if (tsdn == (tsdn_t *)0x0) {
    prVar3 = &local_1a8;
    duckdb_je_rtree_ctx_data_init(prVar3);
  }
  else {
    prVar3 = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  rtree_read_independent
            (tsdn,&emap->rtree,prVar3,
             ((uVar2 & 0xfffffffffffff000) + ((ulong)pvVar1 & 0xfffffffffffff000)) - 0x1000,
             &local_1c0);
  return;
}

Assistant:

void
emap_do_assert_not_mapped(tsdn_t *tsdn, emap_t *emap, edata_t *edata) {
	emap_full_alloc_ctx_t context1 = {0};
	emap_full_alloc_ctx_try_lookup(tsdn, emap, edata_base_get(edata),
	    &context1);
	assert(context1.edata == NULL);

	emap_full_alloc_ctx_t context2 = {0};
	emap_full_alloc_ctx_try_lookup(tsdn, emap, edata_last_get(edata),
	    &context2);
	assert(context2.edata == NULL);
}